

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86rapass.cpp
# Opt level: O2

Error __thiscall
asmjit::x86::RACFGBuilder::onBeforeInvoke(RACFGBuilder *this,InvokeNode *invokeNode)

{
  uint32_t *puVar1;
  uint uVar2;
  BaseCompiler *pBVar3;
  FuncNode *pFVar4;
  char cVar5;
  uint uVar6;
  uint uVar7;
  Error EVar8;
  uint32_t uVar9;
  FuncValuePack *this_00;
  FuncValue *pFVar10;
  Reg *imm_;
  Operand *pOVar11;
  char cVar12;
  InvokeNode *pIVar13;
  InvokeNode *argIndex;
  uint32_t valueIndex;
  size_t sVar14;
  bool bVar15;
  Reg dst;
  RAWorkReg *workReg;
  uint32_t auStack_60 [2];
  InvokeNode *local_58;
  long local_50;
  FuncDetail *local_48;
  InvokeNode *local_40;
  RAWorkReg *workReg_1;
  
  local_48 = &invokeNode->_funcDetail;
  local_40 = (InvokeNode *)(ulong)(invokeNode->_funcDetail)._argCount;
  pBVar3 = (this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc;
  (pBVar3->super_BaseBuilder)._cursor =
       (invokeNode->super_InstNode).super_BaseNode.field_0.field_0._prev;
  uVar6 = (pBVar3->super_BaseBuilder).super_BaseEmitter._gpRegInfo._signature >> 3 & 0x1f;
  argIndex = (InvokeNode *)0x0;
  local_58 = invokeNode;
  do {
    if (argIndex == local_40) {
      pBVar3 = (this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc;
      (pBVar3->super_BaseBuilder)._cursor = (BaseNode *)invokeNode;
      if (((invokeNode->_funcDetail)._callConv._flags & 1) != 0) {
        dst.super_BaseReg.super_Operand.super_Operand_._signature =
             (pBVar3->super_BaseBuilder).super_BaseEmitter._gpRegInfo._signature;
        dst.super_BaseReg.super_Operand.super_Operand_._baseId = 4;
        dst.super_BaseReg.super_Operand.super_Operand_._data[0] = 0;
        dst.super_BaseReg.super_Operand.super_Operand_._data[1] = 0;
        workReg = (RAWorkReg *)0x3;
        auStack_60[1] = 0;
        auStack_60[0] = (invokeNode->_funcDetail)._argStackSize;
        EVar8 = EmitterExplicitT<asmjit::x86::Compiler>::sub
                          ((EmitterExplicitT<asmjit::x86::Compiler> *)pBVar3,(Gp *)&dst,
                           (Imm *)&workReg);
        if (EVar8 != 0) {
          return EVar8;
        }
      }
      if ((invokeNode->_funcDetail)._rets._values[0]._data != 0) {
        sVar14 = 0;
        while ((sVar14 != 4 &&
               (pFVar10 = FuncValuePack::operator[](&(invokeNode->_funcDetail)._rets,sVar14),
               pFVar10->_data != 0))) {
          pOVar11 = InvokeNode::OperandPack::operator[](&invokeNode->_rets,sVar14);
          if (((pOVar11->super_Operand_)._signature & 7) == 1) {
            EVar8 = BaseRAPass::virtIndexAsWorkReg
                              ((this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass,
                               (pOVar11->super_Operand_)._baseId - 0x100,&workReg_1);
            if (EVar8 != 0) {
              return EVar8;
            }
            if ((pFVar10->_data >> 8 & 1) != 0) {
              uVar7 = pFVar10->_data >> 0x18;
              uVar6 = (workReg_1->_info)._signature;
              if (uVar7 == 0x15) {
                if ((uVar6 & 0xf00) != 0x100) {
                  return 0x1a;
                }
                dst.super_BaseReg.super_Operand.super_Operand_._baseId = workReg_1->_virtId;
                dst.super_BaseReg.super_Operand.super_Operand_._data[0] = 0;
                dst.super_BaseReg.super_Operand.super_Operand_._data[1] = 0;
                workReg = (RAWorkReg *)0x2;
                auStack_60[0] = 0;
                auStack_60[1] = 0;
                dst.super_BaseReg.super_Operand.super_Operand_._signature = uVar6;
                uVar9 = Type::baseOf((uint)workReg_1->_virtReg->_typeId);
                cVar12 = (char)pFVar10->_data;
                cVar5 = (char)uVar9;
                if (cVar12 != '\0') {
                  cVar5 = cVar12;
                }
                if (cVar5 == '+') {
                  EVar8 = BaseRAPass::useTemporaryMem
                                    ((this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass,
                                     (BaseMem *)&workReg,8,4);
                  if (EVar8 != 0) {
                    return EVar8;
                  }
                  workReg._0_4_ = CONCAT13(8,workReg._0_3_);
                  EVar8 = EmitterExplicitT<asmjit::x86::Compiler>::fstp
                                    ((EmitterExplicitT<asmjit::x86::Compiler> *)
                                     (this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc,
                                     (Mem *)&workReg);
                  if (EVar8 != 0) {
                    return EVar8;
                  }
                  uVar9 = 0x1c1;
                  if (this->_avxEnabled != false) {
                    uVar9 = 0x443;
                  }
                  EVar8 = BaseEmitter::_emitI((BaseEmitter *)
                                              (this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)
                                              ._cc,uVar9,(Operand_ *)&dst,(Operand_ *)&workReg);
                }
                else {
                  if (cVar5 != '*') {
                    return 0x1a;
                  }
                  EVar8 = BaseRAPass::useTemporaryMem
                                    ((this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass,
                                     (BaseMem *)&workReg,4,4);
                  if (EVar8 != 0) {
                    return EVar8;
                  }
                  workReg._0_4_ = CONCAT13(4,workReg._0_3_);
                  EVar8 = EmitterExplicitT<asmjit::x86::Compiler>::fstp
                                    ((EmitterExplicitT<asmjit::x86::Compiler> *)
                                     (this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._cc,
                                     (Mem *)&workReg);
                  if (EVar8 != 0) {
                    return EVar8;
                  }
                  uVar9 = 0x1c4;
                  if (this->_avxEnabled != false) {
                    uVar9 = 0x446;
                  }
                  EVar8 = BaseEmitter::_emitI((BaseEmitter *)
                                              (this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)
                                              ._cc,uVar9,(Operand_ *)&dst,(Operand_ *)&workReg);
                }
                if (EVar8 != 0) {
                  return EVar8;
                }
              }
              else {
                uVar9 = Reg::groupOf(uVar7);
                if ((uVar6 >> 8 & 0xf) != uVar9) {
                  return 0x1a;
                }
              }
            }
          }
          sVar14 = sVar14 + 1;
        }
      }
      puVar1 = &((this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._curBlock)->_flags;
      *puVar1 = *puVar1 | 0x1000;
      pFVar4 = ((this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass)->_func;
      (pFVar4->_frame)._attributes = (pFVar4->_frame)._attributes | 0x20;
      uVar6 = (invokeNode->_funcDetail)._argStackSize;
      uVar7 = (pFVar4->_frame)._callStackSize;
      if (uVar6 < uVar7) {
        uVar6 = uVar7;
      }
      (pFVar4->_frame)._callStackSize = uVar6;
      return 0;
    }
    this_00 = FuncDetail::argPack(local_48,(size_t)argIndex);
    local_50 = (long)argIndex << 6;
    sVar14 = 0;
    while ((sVar14 != 4 &&
           (pFVar10 = FuncValuePack::operator[](this_00,sVar14), pFVar10->_data != 0))) {
      pFVar10 = FuncValuePack::operator[](this_00,sVar14);
      pIVar13 = argIndex;
      imm_ = (Reg *)InvokeNode::arg(invokeNode,(size_t)argIndex,sVar14);
      uVar7 = (imm_->super_BaseReg).super_Operand.super_Operand_._signature;
      if (uVar7 != 0) {
        uVar7 = uVar7 & 7;
        if (uVar7 == 3) {
          if ((pFVar10->_data & 0x100) == 0) {
            EVar8 = moveImmToStackArg(this,pIVar13,pFVar10,(Imm *)imm_);
LAB_001306e3:
            if (EVar8 != 0) {
              return EVar8;
            }
          }
          else {
            dst.super_BaseReg.super_Operand.super_Operand_._signature = 1;
            dst.super_BaseReg.super_Operand.super_Operand_._baseId = 0xff;
            dst.super_BaseReg.super_Operand.super_Operand_._data[0] = 0;
            dst.super_BaseReg.super_Operand.super_Operand_._data[1] = 0;
            EVar8 = moveImmToRegArg(this,pIVar13,pFVar10,(Imm *)imm_,&dst.super_BaseReg);
            if (EVar8 != 0) {
              return EVar8;
            }
LAB_001306a5:
            pOVar11 = InvokeNode::OperandPack::operator[]
                                ((OperandPack *)
                                 ((long)invokeNode->_args->_data[0]._data + local_50 + -8),sVar14);
            (pOVar11->super_Operand_)._signature =
                 dst.super_BaseReg.super_Operand.super_Operand_._signature;
            (pOVar11->super_Operand_)._baseId =
                 dst.super_BaseReg.super_Operand.super_Operand_._baseId;
            *(ulong *)(pOVar11->super_Operand_)._data =
                 CONCAT44(dst.super_BaseReg.super_Operand.super_Operand_._data[1],
                          dst.super_BaseReg.super_Operand.super_Operand_._data[0]);
          }
        }
        else if (uVar7 == 1) {
          uVar7 = (imm_->super_BaseReg).super_Operand.super_Operand_._baseId - 0x100;
          pIVar13 = (InvokeNode *)(ulong)uVar7;
          EVar8 = BaseRAPass::virtIndexAsWorkReg
                            ((this->super_RACFGBuilderT<asmjit::x86::RACFGBuilder>)._pass,uVar7,
                             &workReg);
          if (EVar8 != 0) {
            return EVar8;
          }
          uVar7 = pFVar10->_data;
          if ((uVar7 >> 8 & 1) == 0) {
            if ((uVar7 >> 10 & 1) != 0) {
              uVar7 = (imm_->super_BaseReg).super_Operand.super_Operand_._signature;
              if ((uVar7 & 0xf00) == 0) {
                if ((uVar7 >> 3 & 0x1f) != uVar6) {
                  return 0x1a;
                }
              }
              else {
                dst.super_BaseReg.super_Operand.super_Operand_._signature = 1;
                dst.super_BaseReg.super_Operand.super_Operand_._baseId = 0xff;
                dst.super_BaseReg.super_Operand.super_Operand_._data[0] = 0;
                dst.super_BaseReg.super_Operand.super_Operand_._data[1] = 0;
                pIVar13 = invokeNode;
                moveVecToPtr(this,invokeNode,pFVar10,(Vec *)imm_,&dst.super_BaseReg);
                imm_ = &dst;
              }
            }
            EVar8 = moveRegToStackArg(this,pIVar13,pFVar10,&imm_->super_BaseReg);
            goto LAB_001306e3;
          }
          uVar2 = (workReg->_info)._signature;
          uVar9 = Reg::groupOf(uVar7 >> 0x18);
          invokeNode = local_58;
          if ((pFVar10->_data & 0x400) == 0) {
            bVar15 = (uVar2 >> 8 & 0xf) == uVar9;
          }
          else {
            uVar7 = (imm_->super_BaseReg).super_Operand.super_Operand_._signature;
            if ((uVar7 & 0xf00) != 0) {
              dst.super_BaseReg.super_Operand.super_Operand_._signature = 1;
              dst.super_BaseReg.super_Operand.super_Operand_._baseId = 0xff;
              dst.super_BaseReg.super_Operand.super_Operand_._data[0] = 0;
              dst.super_BaseReg.super_Operand.super_Operand_._data[1] = 0;
              moveVecToPtr(this,local_58,pFVar10,(Vec *)imm_,&dst.super_BaseReg);
              goto LAB_001306a5;
            }
            bVar15 = (uVar7 >> 3 & 0x1f) == uVar6;
          }
          if (!bVar15) {
            return 0x1a;
          }
        }
      }
      sVar14 = sVar14 + 1;
    }
    argIndex = (InvokeNode *)((long)(argIndex->super_InstNode).super_BaseNode.field_0._links + 1);
  } while( true );
}

Assistant:

Error RACFGBuilder::onBeforeInvoke(InvokeNode* invokeNode) noexcept {
  const FuncDetail& fd = invokeNode->detail();
  uint32_t argCount = invokeNode->argCount();

  cc()->_setCursor(invokeNode->prev());
  uint32_t nativeRegType = cc()->_gpRegInfo.type();

  for (uint32_t argIndex = 0; argIndex < argCount; argIndex++) {
    const FuncValuePack& argPack = fd.argPack(argIndex);
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      if (!argPack[valueIndex])
        break;

      const FuncValue& arg = argPack[valueIndex];
      const Operand& op = invokeNode->arg(argIndex, valueIndex);

      if (op.isNone())
        continue;

      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (arg.isReg()) {
          uint32_t regGroup = workReg->group();
          uint32_t argGroup = Reg::groupOf(arg.regType());

          if (arg.isIndirect()) {
            if (reg.isGp()) {
              if (reg.type() != nativeRegType)
                return DebugUtils::errored(kErrorInvalidAssignment);
              // It's considered allocated if this is an indirect argument and the user used GP.
              continue;
            }

            BaseReg indirectReg;
            moveVecToPtr(invokeNode, arg, reg.as<Vec>(), &indirectReg);
            invokeNode->_args[argIndex][valueIndex] = indirectReg;
          }
          else {
            if (regGroup != argGroup) {
              // TODO: Conversion is not supported.
              return DebugUtils::errored(kErrorInvalidAssignment);
            }
          }
        }
        else {
          if (arg.isIndirect()) {
            if (reg.isGp()) {
              if (reg.type() != nativeRegType)
                return DebugUtils::errored(kErrorInvalidAssignment);

              ASMJIT_PROPAGATE(moveRegToStackArg(invokeNode, arg, reg));
              continue;
            }

            BaseReg indirectReg;
            moveVecToPtr(invokeNode, arg, reg.as<Vec>(), &indirectReg);
            ASMJIT_PROPAGATE(moveRegToStackArg(invokeNode, arg, indirectReg));
          }
          else {
            ASMJIT_PROPAGATE(moveRegToStackArg(invokeNode, arg, reg));
          }
        }
      }
      else if (op.isImm()) {
        if (arg.isReg()) {
          BaseReg reg;
          ASMJIT_PROPAGATE(moveImmToRegArg(invokeNode, arg, op.as<Imm>(), &reg));
          invokeNode->_args[argIndex][valueIndex] = reg;
        }
        else {
          ASMJIT_PROPAGATE(moveImmToStackArg(invokeNode, arg, op.as<Imm>()));
        }
      }
    }
  }

  cc()->_setCursor(invokeNode);
  if (fd.hasFlag(CallConv::kFlagCalleePopsStack))
    ASMJIT_PROPAGATE(cc()->sub(cc()->zsp(), fd.argStackSize()));

  if (fd.hasRet()) {
    for (uint32_t valueIndex = 0; valueIndex < Globals::kMaxValuePack; valueIndex++) {
      const FuncValue& ret = fd.ret(valueIndex);
      if (!ret)
        break;

      const Operand& op = invokeNode->ret(valueIndex);
      if (op.isReg()) {
        const Reg& reg = op.as<Reg>();
        RAWorkReg* workReg;
        ASMJIT_PROPAGATE(_pass->virtIndexAsWorkReg(Operand::virtIdToIndex(reg.id()), &workReg));

        if (ret.isReg()) {
          if (ret.regType() == Reg::kTypeSt) {
            if (workReg->group() != Reg::kGroupVec)
              return DebugUtils::errored(kErrorInvalidAssignment);

            Reg dst = Reg::fromSignatureAndId(workReg->signature(), workReg->virtId());
            Mem mem;

            uint32_t typeId = Type::baseOf(workReg->typeId());
            if (ret.hasTypeId())
              typeId = ret.typeId();

            switch (typeId) {
              case Type::kIdF32:
                ASMJIT_PROPAGATE(_pass->useTemporaryMem(mem, 4, 4));
                mem.setSize(4);
                ASMJIT_PROPAGATE(cc()->fstp(mem));
                ASMJIT_PROPAGATE(cc()->emit(choose(Inst::kIdMovss, Inst::kIdVmovss), dst.as<Xmm>(), mem));
                break;

              case Type::kIdF64:
                ASMJIT_PROPAGATE(_pass->useTemporaryMem(mem, 8, 4));
                mem.setSize(8);
                ASMJIT_PROPAGATE(cc()->fstp(mem));
                ASMJIT_PROPAGATE(cc()->emit(choose(Inst::kIdMovsd, Inst::kIdVmovsd), dst.as<Xmm>(), mem));
                break;

              default:
                return DebugUtils::errored(kErrorInvalidAssignment);
            }
          }
          else {
            uint32_t regGroup = workReg->group();
            uint32_t retGroup = Reg::groupOf(ret.regType());

            if (regGroup != retGroup) {
              // TODO: Conversion is not supported.
              return DebugUtils::errored(kErrorInvalidAssignment);
            }
          }
        }
      }
    }
  }

  // This block has function call(s).
  _curBlock->addFlags(RABlock::kFlagHasFuncCalls);
  _pass->func()->frame().addAttributes(FuncFrame::kAttrHasFuncCalls);
  _pass->func()->frame().updateCallStackSize(fd.argStackSize());

  return kErrorOk;
}